

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int tree_5_3::toThread(Btree t,Btree pre)

{
  int iVar1;
  node *pnVar2;
  int iVar3;
  Btree t_00;
  Btree pnVar4;
  
  pnVar4 = t->left;
  toThread(pnVar4,pre);
  toThread(pnVar4,(Btree)0x0);
  t_00 = (Btree)(ulong)(uint)pnVar4->data;
  printf("%c\t");
  pnVar4 = pnVar4->left;
  preOrderTraverse(pnVar4);
  pnVar2 = pnVar4->left;
  inOrderTraverse((tree_5_3 *)pnVar2,t_00);
  pnVar2 = pnVar2->left;
  postOrderTraverse((tree_5_3 *)pnVar2,t_00);
  for (; pnVar2 != (node *)0x0; pnVar2 = pnVar2->left) {
    iVar1 = pnVar2->data;
    iVar3 = (int)t_00;
    if (iVar1 == iVar3) goto LAB_00102b83;
    if (iVar1 <= iVar3) {
      if (iVar3 <= iVar1) break;
      pnVar2 = (node *)&pnVar2->right;
    }
  }
  pnVar2 = (node *)0x0;
LAB_00102b83:
  return (int)pnVar2;
}

Assistant:

int toThread(Btree t, Btree pre) {
        if (t != nullptr) {
            toThread(t->left, pre);
            if (t->left == nullptr) {
                t->left = pre;
                t->ltag = 1;
            }
            if (pre != nullptr && pre->right == nullptr) {
                pre->right = t;
                pre->rtag = 1;
            }
            pre = t;
            toThread(t->right, pre);
        }
    }